

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qhttpnetworkconnectionchannel_p.cpp
# Opt level: O2

void QHttpNetworkConnectionChannel::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  undefined8 *puVar1;
  InterfaceType *pIVar2;
  undefined4 in_register_00000034;
  
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 4:
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_001f274e;
      pIVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket_*>::metaType;
      break;
    case 5:
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_001f274e;
      pIVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QLocalSocket_*>::metaType;
      break;
    default:
      puVar1 = (undefined8 *)*_a;
LAB_001f274e:
      *puVar1 = 0;
      return;
    case 7:
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_001f274e;
      pIVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QAbstractSocket::SocketError>::metaType;
      break;
    case 8:
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_001f274e;
      pIVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QNetworkProxy>::metaType;
      break;
    case 0xb:
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_001f274e;
      pIVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QSslError>_>::metaType;
      break;
    case 0xc:
      puVar1 = (undefined8 *)*_a;
      if (*_a[1] != 0) goto LAB_001f274e;
      pIVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QSslPreSharedKeyAuthenticator_*>::metaType;
    }
    *puVar1 = pIVar2;
  }
  else if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      _q_receiveReply((QHttpNetworkConnectionChannel *)_o);
      return;
    case 1:
      _q_bytesWritten((QHttpNetworkConnectionChannel *)_o,CONCAT44(in_register_00000034,_c));
      return;
    case 2:
      _q_readyRead((QHttpNetworkConnectionChannel *)_o);
      return;
    case 3:
      _q_disconnected((QHttpNetworkConnectionChannel *)_o);
      return;
    case 4:
      _q_connected_abstract_socket((QHttpNetworkConnectionChannel *)_o,*_a[1]);
      return;
    case 5:
      _q_connected_local_socket((QHttpNetworkConnectionChannel *)_o,*_a[1]);
      return;
    case 6:
      _q_connected((QHttpNetworkConnectionChannel *)_o);
      return;
    case 7:
      _q_error((QHttpNetworkConnectionChannel *)_o,*_a[1]);
      return;
    case 8:
      _q_proxyAuthenticationRequired
                ((QHttpNetworkConnectionChannel *)_o,(QNetworkProxy *)_a[1],*_a[2]);
      return;
    case 9:
      _q_uploadDataReadyRead((QHttpNetworkConnectionChannel *)_o);
      return;
    case 10:
      _q_encrypted((QHttpNetworkConnectionChannel *)_o);
      return;
    case 0xb:
      _q_sslErrors((QHttpNetworkConnectionChannel *)_o,(QList<QSslError> *)_a[1]);
      return;
    case 0xc:
      _q_preSharedKeyAuthenticationRequired((QHttpNetworkConnectionChannel *)_o,*_a[1]);
      return;
    case 0xd:
      _q_encryptedBytesWritten
                ((QHttpNetworkConnectionChannel *)_o,CONCAT44(in_register_00000034,_c));
      return;
    }
  }
  return;
}

Assistant:

void QHttpNetworkConnectionChannel::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QHttpNetworkConnectionChannel *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->_q_receiveReply(); break;
        case 1: _t->_q_bytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        case 2: _t->_q_readyRead(); break;
        case 3: _t->_q_disconnected(); break;
        case 4: _t->_q_connected_abstract_socket((*reinterpret_cast< std::add_pointer_t<QAbstractSocket*>>(_a[1]))); break;
        case 5: _t->_q_connected_local_socket((*reinterpret_cast< std::add_pointer_t<QLocalSocket*>>(_a[1]))); break;
        case 6: _t->_q_connected(); break;
        case 7: _t->_q_error((*reinterpret_cast< std::add_pointer_t<QAbstractSocket::SocketError>>(_a[1]))); break;
        case 8: _t->_q_proxyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QNetworkProxy>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAuthenticator*>>(_a[2]))); break;
        case 9: _t->_q_uploadDataReadyRead(); break;
        case 10: _t->_q_encrypted(); break;
        case 11: _t->_q_sslErrors((*reinterpret_cast< std::add_pointer_t<QList<QSslError>>>(_a[1]))); break;
        case 12: _t->_q_preSharedKeyAuthenticationRequired((*reinterpret_cast< std::add_pointer_t<QSslPreSharedKeyAuthenticator*>>(_a[1]))); break;
        case 13: _t->_q_encryptedBytesWritten((*reinterpret_cast< std::add_pointer_t<qint64>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket* >(); break;
            }
            break;
        case 5:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QLocalSocket* >(); break;
            }
            break;
        case 7:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QAbstractSocket::SocketError >(); break;
            }
            break;
        case 8:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QNetworkProxy >(); break;
            }
            break;
        case 11:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QList<QSslError> >(); break;
            }
            break;
        case 12:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QSslPreSharedKeyAuthenticator* >(); break;
            }
            break;
        }
    }
}